

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::Distance> * metaf::Distance::fromKmString(string *s)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  ulong in_RSI;
  optional<metaf::Distance> *in_RDI;
  Distance distance;
  optional<unsigned_int> dist;
  unsigned_long numLen;
  Distance *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  
  lVar3 = std::__cxx11::string::length();
  if ((lVar3 != 3) && (lVar3 = std::__cxx11::string::length(), lVar3 != 4)) {
    *(undefined8 *)
     &(in_RDI->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::Distance>._M_payload = 0;
    *(undefined8 *)
     ((long)&(in_RDI->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
             super__Optional_base<unsigned_int,_true,_true>._M_payload + 4) = 0;
    *(undefined4 *)
     &(in_RDI->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::Distance>._M_engaged = 0;
    return in_RDI;
  }
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)&stack0xffffffffffffffd0,in_RSI);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                          (char *)in_stack_ffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  if ((bVar1 & 1) == 0) {
    strToUint(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    bVar2 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x25102c);
    if (bVar2) {
      Distance((Distance *)CONCAT17(bVar1,in_stack_ffffffffffffff90));
      std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x251071);
      std::optional<unsigned_int>::optional<unsigned_int,_true>
                ((optional<unsigned_int> *)CONCAT17(bVar1,in_stack_ffffffffffffff90),
                 &in_stack_ffffffffffffff88->distModifier);
      std::optional<metaf::Distance>::optional<metaf::Distance,_true>
                ((optional<metaf::Distance> *)CONCAT17(bVar1,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
    }
    else {
      *(undefined8 *)
       &(in_RDI->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_payload = 0;
      *(undefined8 *)
       ((long)&(in_RDI->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
               super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
               super__Optional_base<unsigned_int,_true,_true>._M_payload + 4) = 0;
      *(undefined4 *)
       &(in_RDI->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_engaged = 0;
    }
  }
  else {
    *(undefined8 *)
     &(in_RDI->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::Distance>._M_payload = 0;
    *(undefined8 *)
     ((long)&(in_RDI->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
             super__Optional_base<unsigned_int,_true,_true>._M_payload + 4) = 0;
    *(undefined4 *)
     &(in_RDI->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::Distance>._M_engaged = 0;
  }
  return in_RDI;
}

Assistant:

std::optional<Distance> Distance::fromKmString(const std::string & s) {
	//static const std::regex rgx ("(\\d\\d?)KM");
	static const std::optional<Distance> error;
	static const auto metersPerKm = 1000u;

	if (s.length() != 3 && s.length() != 4) return error;

	static const char kmStr[] = "KM"; 
	static const size_t kmStrLen = std::strlen(kmStr);
	const auto numLen = s.length() - kmStrLen;
	if (s.substr(numLen) != kmStr) return error;

	const auto dist = strToUint(s, 0, numLen);
	if (!dist.has_value()) return error;

	Distance distance;
	distance.distUnit = Unit::METERS;
	distance.dist = *dist * metersPerKm;
	return distance;
}